

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O2

TypedAttribute<Imf_2_5::Envmap> * __thiscall
Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Envmap>>
          (Header *this,char *name)

{
  const_iterator cVar1;
  TypedAttribute<Imf_2_5::Envmap> *pTVar2;
  Name local_110;
  
  Name::Name(&local_110,name);
  cVar1 = std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
          ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                  *)this,&local_110);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) ||
     (*(long *)(cVar1._M_node + 9) == 0)) {
    pTVar2 = (TypedAttribute<Imf_2_5::Envmap> *)0x0;
  }
  else {
    pTVar2 = (TypedAttribute<Imf_2_5::Envmap> *)
             __dynamic_cast(*(long *)(cVar1._M_node + 9),&Attribute::typeinfo,
                            &TypedAttribute<Imf_2_5::Envmap>::typeinfo,0);
  }
  return pTVar2;
}

Assistant:

const T *
Header::findTypedAttribute (const char name[]) const
{
    AttributeMap::const_iterator i = _map.find (name);
    return (i == _map.end())? 0: dynamic_cast <const T*> (i->second);
}